

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_4;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_3;
  CheckerInstantiationSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ParameterValueAssignmentSyntax *in_stack_ffffffffffffffb0;
  ParameterValueAssignmentSyntax *local_48;
  
  args_4 = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x814b6e);
  args_3 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
           deepClone<slang::syntax::NameSyntax>
                     ((NameSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(long *)(__fn + 0x58) == 0) {
    local_48 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::ParameterValueAssignmentSyntax>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  deepClone<slang::syntax::HierarchicalInstanceSyntax>(in_stack_00000100,in_stack_000000f8);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NameSyntax&,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_48,
                      (NameSyntax *)TVar2.info,TVar2._0_8_,args_3,(Token *)args_4);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<NameSyntax>(*node.type, alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}